

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

UnicodeString *
icu_63::TimeZoneFormat::truncateOffsetPattern
          (UnicodeString *offsetHM,UnicodeString *result,UErrorCode *status)

{
  short sVar1;
  int32_t iVar2;
  int32_t iVar3;
  uint start;
  uint uVar4;
  undefined4 uVar5;
  UChar HH [2];
  UChar local_6c [2];
  UnicodeString local_68;
  
  UnicodeString::setToBogus(result);
  if (U_ZERO_ERROR < *status) {
    return result;
  }
  sVar1 = (offsetHM->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (offsetHM->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  start = (int)uVar4 >> 0x1f & uVar4;
  iVar2 = UnicodeString::indexOf(offsetHM,L"mm",0,2,start,uVar4 - start);
  if (iVar2 < 0) {
LAB_0020c729:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    local_6c[0] = L'H';
    local_6c[1] = L'H';
    UnicodeString::tempSubString(&local_68,offsetHM,0,iVar2);
    uVar5 = local_68.fUnion.fFields.fLength;
    if (-1 < local_68.fUnion.fStackFields.fLengthAndFlags) {
      uVar5 = (int)local_68.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    uVar4 = (int)uVar5 >> 0x1f & uVar5;
    iVar3 = UnicodeString::lastIndexOf(&local_68,local_6c,0,2,uVar4,uVar5 - uVar4);
    UnicodeString::~UnicodeString(&local_68);
    if (iVar3 < 0) {
      UnicodeString::tempSubString(&local_68,offsetHM,0,iVar2);
      if (-1 < local_68.fUnion.fStackFields.fLengthAndFlags) {
        local_68.fUnion.fFields.fLength = (int)local_68.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      uVar4 = local_68.fUnion.fFields.fLength >> 0x1f & local_68.fUnion.fFields.fLength;
      iVar2 = UnicodeString::doLastIndexOf
                        (&local_68,L'H',uVar4,local_68.fUnion.fFields.fLength - uVar4);
      UnicodeString::~UnicodeString(&local_68);
      if (iVar2 < 0) goto LAB_0020c729;
      UnicodeString::tempSubString(&local_68,offsetHM,0,iVar2 + 1);
      result = UnicodeString::copyFrom(result,&local_68,'\0');
    }
    else {
      UnicodeString::tempSubString(&local_68,offsetHM,0,iVar3 + 2);
      result = UnicodeString::copyFrom(result,&local_68,'\0');
    }
    UnicodeString::~UnicodeString(&local_68);
  }
  return result;
}

Assistant:

UnicodeString&
TimeZoneFormat::truncateOffsetPattern(const UnicodeString& offsetHM, UnicodeString& result, UErrorCode& status) {
    result.setToBogus();
    if (U_FAILURE(status)) {
        return result;
    }
    U_ASSERT(u_strlen(DEFAULT_GMT_OFFSET_MINUTE_PATTERN) == 2);

    int32_t idx_mm = offsetHM.indexOf(DEFAULT_GMT_OFFSET_MINUTE_PATTERN, 2, 0);
    if (idx_mm < 0) {
        // Bad time zone hour pattern data
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }
    UChar HH[] = {0x0048, 0x0048};
    int32_t idx_HH = offsetHM.tempSubString(0, idx_mm).lastIndexOf(HH, 2, 0);
    if (idx_HH >= 0) {
        return result.setTo(offsetHM.tempSubString(0, idx_HH + 2));
    }
    int32_t idx_H = offsetHM.tempSubString(0, idx_mm).lastIndexOf((UChar)0x0048, 0);
    if (idx_H >= 0) {
        return result.setTo(offsetHM.tempSubString(0, idx_H + 1));
    }
    // Bad time zone hour pattern data
    status = U_ILLEGAL_ARGUMENT_ERROR;
    return result;
}